

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkTimeSetOutputLoad(Abc_Ntk_t *pNtk,int PoNum,float Rise,float Fall)

{
  float fVar1;
  Abc_ManTime_t *pAVar2;
  Abc_Time_t *pAVar3;
  long lVar4;
  size_t __nmemb;
  
  if ((PoNum < 0) || (pNtk->vCos->nSize <= PoNum)) {
    __assert_fail("PoNum >= 0 && PoNum < Abc_NtkCoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,0x135,"void Abc_NtkTimeSetOutputLoad(Abc_Ntk_t *, int, float, float)");
  }
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar2 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar2;
  }
  pAVar2 = pNtk->pManTime;
  fVar1 = (pAVar2->tOutLoadDef).Rise;
  if ((fVar1 == Rise) && (!NAN(fVar1) && !NAN(Rise))) {
    fVar1 = (pAVar2->tOutLoadDef).Fall;
    if ((fVar1 == Fall) && (!NAN(fVar1) && !NAN(Fall))) {
      return;
    }
  }
  if (pAVar2->tOutLoad == (Abc_Time_t *)0x0) {
    __nmemb = (size_t)pNtk->vCos->nSize;
    pAVar3 = (Abc_Time_t *)calloc(__nmemb,8);
    pAVar2->tOutLoad = pAVar3;
    if (0 < (long)__nmemb) {
      lVar4 = 0;
      do {
        pNtk->pManTime->tOutLoad[lVar4] = pNtk->pManTime->tOutLoadDef;
        lVar4 = lVar4 + 1;
      } while (lVar4 < pNtk->vCos->nSize);
    }
  }
  pAVar3 = pNtk->pManTime->tOutLoad;
  pAVar3[(uint)PoNum].Rise = Rise;
  pAVar3[(uint)PoNum].Fall = Fall;
  return;
}

Assistant:

void Abc_NtkTimeSetOutputLoad( Abc_Ntk_t * pNtk, int PoNum, float Rise, float Fall )
{
    Abc_Time_t * pTime;
    assert( PoNum >= 0 && PoNum < Abc_NtkCoNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    if ( pNtk->pManTime->tOutLoadDef.Rise == Rise && pNtk->pManTime->tOutLoadDef.Fall == Fall )
        return;
    if ( pNtk->pManTime->tOutLoad == NULL )
    {
        int i;
        pNtk->pManTime->tOutLoad = ABC_CALLOC( Abc_Time_t, Abc_NtkCoNum(pNtk) );
        for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
            pNtk->pManTime->tOutLoad[i] = pNtk->pManTime->tOutLoadDef;
    }
    pTime = pNtk->pManTime->tOutLoad + PoNum;
    pTime->Rise  = Rise;
    pTime->Fall  = Fall;
}